

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dgTypes.cpp
# Opt level: O2

HaI32 dgVertexListToIndexList
                (HaF32 *vertList,HaI32 strideInBytes,HaI32 floatSizeInBytes,
                HaI32 unsignedSizeInBytes,HaI32 vertexCount,HaI32 *indexList,HaF32 tolerance)

{
  uint uVar1;
  uint uVar2;
  double *vertList_00;
  double *pdVar3;
  HaF32 *pHVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  dgStack<double> pool;
  dgStack<double> local_40;
  
  if (unsignedSizeInBytes == 0) {
    uVar1 = strideInBytes >> 2;
    dgStack<double>::dgStack(&local_40,uVar1 * vertexCount);
    vertList_00 = dgStack<double>::operator[](&local_40,0);
    uVar7 = (ulong)(~(strideInBytes >> 0x1f) & uVar1);
    pdVar3 = vertList_00;
    pHVar4 = vertList;
    for (uVar6 = 0; uVar6 != (uint)(~(vertexCount >> 0x1f) & vertexCount); uVar6 = uVar6 + 1) {
      for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        pdVar3[uVar5] = (double)(float)pHVar4[uVar5];
      }
      pdVar3 = pdVar3 + (int)uVar1;
      pHVar4 = pHVar4 + (int)uVar1;
    }
    uVar2 = dgVertexListToIndexList
                      ((HaF64 *)vertList_00,uVar1 << 3,floatSizeInBytes >> 2,vertexCount,indexList,
                       (HaF64)(double)(float)tolerance);
    for (uVar6 = 0; uVar6 != (~((int)uVar2 >> 0x1f) & uVar2); uVar6 = uVar6 + 1) {
      for (uVar5 = 0; uVar7 != uVar5; uVar5 = uVar5 + 1) {
        vertList[uVar5] = (HaF32)(float)vertList_00[uVar5];
      }
      vertList = vertList + (int)uVar1;
      vertList_00 = vertList_00 + (int)uVar1;
    }
    free(local_40.super_dgStackBase.m_ptr);
    return uVar2;
  }
  __assert_fail("!unsignedSizeInBytes",
                "/workspace/llm4binary/github/license_all_cmakelists_25/cecilysunday[P]chrono/src/chrono_thirdparty/HACDv2/dgTypes.cpp"
                ,0x195,
                "hacd::HaI32 dgVertexListToIndexList(hacd::HaF32 *const, hacd::HaI32, hacd::HaI32, hacd::HaI32, hacd::HaI32, hacd::HaI32 *const, hacd::HaF32)"
               );
}

Assistant:

hacd::HaI32 dgVertexListToIndexList (hacd::HaF32* const vertList, hacd::HaI32 strideInBytes, hacd::HaI32 floatSizeInBytes, hacd::HaI32 unsignedSizeInBytes, hacd::HaI32 vertexCount, hacd::HaI32* const indexList, hacd::HaF32 tolerance)
{
	HACD_FORCE_PARAMETER_REFERENCE(unsignedSizeInBytes);
	hacd::HaI32 stride = strideInBytes / sizeof (hacd::HaF32);

	HACD_ASSERT (!unsignedSizeInBytes);
	dgStack<hacd::HaF64> pool(vertexCount * stride);

	hacd::HaI32 floatCount = floatSizeInBytes / sizeof (hacd::HaF32);

	hacd::HaF64* const data = &pool[0];
	for (hacd::HaI32 i = 0; i < vertexCount; i ++) {

		hacd::HaF64* const dst = &data[i * stride];
		hacd::HaF32* const src = &vertList[i * stride];
		for (hacd::HaI32 j = 0; j < stride; j ++) {
			dst[j] = src[j];
		}
	}

	hacd::HaI32 count = dgVertexListToIndexList (data, stride * sizeof (hacd::HaF64), floatCount, vertexCount, indexList, hacd::HaF64 (tolerance));
	for (hacd::HaI32 i = 0; i < count; i ++) {
		hacd::HaF64* const src = &data[i * stride];
		hacd::HaF32* const dst = &vertList[i * stride];
		for (hacd::HaI32 j = 0; j < stride; j ++) {
			dst[j] = hacd::HaF32 (src[j]);
		}
	}
	
	return count;
}